

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void rw::memLittle16_func(void *data,uint32 size)

{
  undefined2 uVar1;
  undefined1 *puVar2;
  undefined2 *local_28;
  uint16 *words;
  uint8 *bytes;
  uint16 w;
  uint32 size_local;
  void *data_local;
  
  local_28 = (undefined2 *)data;
  words = (uint16 *)data;
  bytes._4_4_ = size >> 1;
  while (bytes._4_4_ != 0) {
    uVar1 = *local_28;
    puVar2 = (undefined1 *)((long)words + 1);
    *(char *)words = (char)uVar1;
    words = words + 1;
    *puVar2 = (char)((ushort)uVar1 >> 8);
    local_28 = local_28 + 1;
    bytes._4_4_ = bytes._4_4_ - 1;
  }
  return;
}

Assistant:

void
memLittle16_func(void *data, uint32 size)
{
	uint16 w;
	uint8 *bytes = (uint8*)data;
	uint16 *words = (uint16*)data;
	size >>= 1;
	while(size--){
		w = *words++;
		*bytes++ = (uint8)w;
		*bytes++ = w >> 8;
	}
}